

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_merge(kvtree *hash1,kvtree *hash2)

{
  int iVar1;
  char *key_00;
  kvtree *pkVar2;
  kvtree *key_hash2;
  kvtree *key_hash1;
  char *key;
  kvtree_elem *elem;
  int rc;
  kvtree *hash2_local;
  kvtree *hash1_local;
  
  if (hash1 == (kvtree *)0x0) {
    hash1_local._4_4_ = 1;
  }
  else if (hash2 == (kvtree *)0x0) {
    hash1_local._4_4_ = 0;
  }
  else {
    elem._4_4_ = 0;
    for (key = (char *)kvtree_elem_first(hash2); key != (char *)0x0;
        key = (char *)kvtree_elem_next((kvtree_elem *)key)) {
      key_00 = kvtree_elem_key((kvtree_elem *)key);
      key_hash2 = kvtree_get(hash1,key_00);
      if (key_hash2 == (kvtree *)0x0) {
        pkVar2 = kvtree_new();
        key_hash2 = kvtree_set(hash1,key_00,pkVar2);
      }
      pkVar2 = kvtree_elem_hash((kvtree_elem *)key);
      iVar1 = kvtree_merge(key_hash2,pkVar2);
      if (iVar1 != 0) {
        elem._4_4_ = 1;
      }
    }
    hash1_local._4_4_ = elem._4_4_;
  }
  return hash1_local._4_4_;
}

Assistant:

int kvtree_merge(kvtree* hash1, const kvtree* hash2)
{
  /* need hash1 to be valid to insert anything into it */
  if (hash1 == NULL) {
    return KVTREE_FAILURE;
  }

  /* if hash2 is NULL, there is nothing to insert, so we're done */
  if (hash2 == NULL) {
    return KVTREE_SUCCESS;
  }

  int rc = KVTREE_SUCCESS;

  /* iterate over the elements in hash2 */
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash2);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get the key for this element */
    char* key = kvtree_elem_key(elem);

    /* get hash for the matching element in hash1, if it has one */
    kvtree* key_hash1 = kvtree_get(hash1, key);
    if (key_hash1 == NULL) {
      /* hash1 had no element with this key, so create one */
      key_hash1 = kvtree_set(hash1, key, kvtree_new());
    }

    /* merge the hash for this key from hash2 with the hash for this
     * key from hash1 */
    kvtree* key_hash2 = kvtree_elem_hash(elem);
    if (kvtree_merge(key_hash1, key_hash2) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
    }
  }

  return rc;
}